

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O2

void __thiscall
soplex::SPxLPBase<double>::doAddRow
          (SPxLPBase<double> *this,double *lhsValue,SVectorBase<double> *rowVec,double *rhsValue,
          bool scale)

{
  int iVar1;
  int iVar2;
  Item *pIVar3;
  Nonzero<double> *pNVar4;
  double *pdVar5;
  int iVar6;
  ulong uVar7;
  undefined7 in_register_00000081;
  double dVar8;
  int local_9c;
  int idx;
  double val;
  ulong local_78;
  Item *local_70;
  LPColBase<double> empty;
  
  iVar1 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  iVar2 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  empty.up = 0.0;
  val = (double)((ulong)val & 0xffffffff00000000);
  idx = iVar1;
  LPRowSetBase<double>::add
            (&this->super_LPRowSetBase<double>,lhsValue,rowVec,rhsValue,&empty.up,(int *)&val);
  if ((int)CONCAT71(in_register_00000081,scale) == 0) {
    local_9c = 0;
  }
  else {
    local_9c = (*this->lp_scaler->_vptr_SPxScaler[1])
                         (this->lp_scaler,rowVec,&(this->super_LPColSetBase<double>).scaleExp);
    dVar8 = (this->super_LPRowSetBase<double>).right.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar1];
    pdVar5 = (double *)infinity();
    if (dVar8 < *pdVar5) {
      dVar8 = ldexp((this->super_LPRowSetBase<double>).right.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar1],local_9c);
      (this->super_LPRowSetBase<double>).right.val.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [iVar1] = dVar8;
    }
    dVar8 = (this->super_LPRowSetBase<double>).left.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar1];
    pdVar5 = (double *)infinity();
    if (-*pdVar5 < dVar8) {
      dVar8 = ldexp((this->super_LPRowSetBase<double>).left.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar1],local_9c);
      (this->super_LPRowSetBase<double>).left.val.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [iVar1] = dVar8;
    }
    dVar8 = ldexp((this->super_LPRowSetBase<double>).object.val.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar1],local_9c);
    (this->super_LPRowSetBase<double>).object.val.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [iVar1] = dVar8;
    (this->super_LPRowSetBase<double>).scaleExp.data[iVar1] = local_9c;
  }
  pIVar3 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem;
  iVar1 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[iVar1].idx;
  local_70 = pIVar3 + iVar1;
  uVar7 = (ulong)(uint)pIVar3[iVar1].data.super_SVectorBase<double>.memused;
  while (pIVar3 = local_70, 0 < (int)uVar7) {
    uVar7 = uVar7 - 1;
    pNVar4 = (local_70->data).super_SVectorBase<double>.m_elem;
    iVar1 = pNVar4[uVar7].idx;
    dVar8 = pNVar4[uVar7].val;
    if (scale) {
      local_78 = uVar7;
      dVar8 = ldexp(dVar8,(this->super_LPColSetBase<double>).scaleExp.data[iVar1] + local_9c);
      (pIVar3->data).super_SVectorBase<double>.m_elem[uVar7].val = dVar8;
      uVar7 = local_78;
    }
    val = dVar8;
    if ((this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum <= iVar1) {
      LPColBase<double>::LPColBase(&empty,0);
      for (iVar6 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
          iVar6 <= iVar1; iVar6 = iVar6 + 1) {
        LPColSetBase<double>::add(&this->super_LPColSetBase<double>,&empty);
      }
      DSVectorBase<double>::~DSVectorBase(&empty.vec);
    }
    LPColSetBase<double>::add2(&this->super_LPColSetBase<double>,iVar1,1,&idx,&val);
  }
  (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x50])(this,1);
  (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x51])
            (this,(ulong)(uint)((this->super_LPColSetBase<double>).super_SVSetBase<double>.set.
                                thenum - iVar2));
  return;
}

Assistant:

void doAddRow(const R& lhsValue, const SVectorBase<R>& rowVec, const R& rhsValue,
                 bool scale = false)
   {
      int idx = nRows();
      int oldColNumber = nCols();
      int newRowScaleExp = 0;

      LPRowSetBase<R>::add(lhsValue, rowVec, rhsValue);

      DataArray <int>& colscaleExp = LPColSetBase<R>::scaleExp;

      // compute new row scaling factor and apply it to the sides
      if(scale)
      {
         newRowScaleExp = lp_scaler->computeScaleExp(rowVec, colscaleExp);

         if(rhs(idx) < R(infinity))
            rhs_w(idx) = spxLdexp(rhs_w(idx), newRowScaleExp);

         if(lhs(idx) > R(-infinity))
            lhs_w(idx) = spxLdexp(lhs_w(idx), newRowScaleExp);

         maxRowObj_w(idx) = spxLdexp(maxRowObj_w(idx), newRowScaleExp);

         LPRowSetBase<R>::scaleExp[idx] = newRowScaleExp;
      }

      SVectorBase<R>& vec = rowVector_w(idx);

      // now insert nonzeros to column file also
      for(int j = vec.size() - 1; j >= 0; --j)
      {
         int i = vec.index(j);

         // apply new row and existing column scaling factors to new values in RowSet
         if(scale)
            vec.value(j) = spxLdexp(vec.value(j), newRowScaleExp + colscaleExp[i]);

         R val = vec.value(j);

         // create new columns if required
         if(i >= nCols())
         {
            LPColBase<R> empty;

            for(int k = nCols(); k <= i; ++k)
               LPColSetBase<R>::add(empty);
         }

         assert(i < nCols());
         LPColSetBase<R>::add2(i, 1, &idx, &val);
      }

      addedRows(1);
      addedCols(nCols() - oldColNumber);
   }